

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

char * __thiscall AActor::GetTag(AActor *this,char *def)

{
  MetaClass *pMVar1;
  char *tag;
  char *def_local;
  AActor *this_local;
  
  if (this->Tag == (FString *)0x0) {
    this_local = (AActor *)def;
    if (def == (char *)0x0) {
      pMVar1 = GetClass(this);
      this_local = (AActor *)
                   FName::GetChars(&(pMVar1->super_PClass).super_PNativeStruct.super_PStruct.
                                    super_PNamedType.TypeName);
    }
  }
  else {
    this_local = (AActor *)FString::GetChars(this->Tag);
    if (*(char *)&(this_local->super_DThinker).super_DObject._vptr_DObject == '$') {
      this_local = (AActor *)
                   FStringTable::operator()
                             (&GStrings,
                              (char *)((long)&(this_local->super_DThinker).super_DObject.
                                              _vptr_DObject + 1));
    }
  }
  return (char *)this_local;
}

Assistant:

const char *AActor::GetTag(const char *def) const
{
	if (Tag != NULL)
	{
		const char *tag = Tag->GetChars();
		if (tag[0] == '$')
		{
			return GStrings(tag + 1);
		}
		else
		{
			return tag;
		}
	}
	else if (def)
	{
		return def;
	}
	else
	{
		return GetClass()->TypeName.GetChars();
	}
}